

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

float * __thiscall ON_3fPoint::operator[](ON_3fPoint *this,uint i)

{
  ON_3fPoint *local_38;
  ON_3fPoint *local_30;
  float *pd;
  uint i_local;
  ON_3fPoint *this_local;
  
  local_30 = this;
  if (i != 0) {
    if (i < 2) {
      local_38 = (ON_3fPoint *)&this->y;
    }
    else {
      local_38 = (ON_3fPoint *)&this->z;
    }
    local_30 = local_38;
  }
  return &local_30->x;
}

Assistant:

float& ON_3fPoint::operator[](unsigned int i)
{
  float* pd = (i<=0)? &x : ( (i>=2) ?  &z : &y);
  return *pd;
}